

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_Player(FParser *this)

{
  AActor *local_18;
  AActor *mo;
  FParser *this_local;
  
  if (this->t_argc == 0) {
    local_18 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->Script->trigger);
  }
  else {
    local_18 = actorvalue(this->t_argv);
  }
  (this->t_return).type = 1;
  if ((local_18 == (AActor *)0x0) || (local_18->player == (player_t *)0x0)) {
    (this->t_return).value.i = -1;
  }
  else {
    (this->t_return).value.i = (int)((long)&local_18->player[-0x519b].ConversationNPC / 0x2a0);
  }
  return;
}

Assistant:

void FParser::SF_Player(void)
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	t_return.type = svt_int;
	
	if(mo && mo->player) // haleyjd: added mo->player
	{
		t_return.value.i = (int)(mo->player - players);
	}
	else
	{
		t_return.value.i = -1;
	}
}